

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_color nk_panel_get_border_color(nk_style *style,nk_panel_type type)

{
  nk_panel_type type_local;
  nk_style *style_local;
  
  if (type != NK_PANEL_WINDOW) {
    if (type == NK_PANEL_GROUP) {
      return (style->window).group_border_color;
    }
    if (type == NK_PANEL_POPUP) {
      return (style->window).popup_border_color;
    }
    if (type == NK_PANEL_CONTEXTUAL) {
      return (style->window).contextual_border_color;
    }
    if (type == NK_PANEL_COMBO) {
      return (style->window).combo_border_color;
    }
    if (type == NK_PANEL_MENU) {
      return (style->window).menu_border_color;
    }
    if (type == NK_PANEL_TOOLTIP) {
      return (style->window).menu_border_color;
    }
  }
  return (style->window).border_color;
}

Assistant:

NK_LIB struct nk_color
nk_panel_get_border_color(const struct nk_style *style, enum nk_panel_type type)
{
    switch (type) {
    default:
    case NK_PANEL_WINDOW: return style->window.border_color;
    case NK_PANEL_GROUP: return style->window.group_border_color;
    case NK_PANEL_POPUP: return style->window.popup_border_color;
    case NK_PANEL_CONTEXTUAL: return style->window.contextual_border_color;
    case NK_PANEL_COMBO: return style->window.combo_border_color;
    case NK_PANEL_MENU: return style->window.menu_border_color;
    case NK_PANEL_TOOLTIP: return style->window.menu_border_color;}
}